

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Config::~Config(Config *this)

{
  ConfigData *in_RDI;
  vector<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_> *unaff_retaddr
  ;
  
  *(undefined ***)in_RDI = &PTR__Config_002a6038;
  TestSpec::~TestSpec((TestSpec *)in_RDI);
  std::vector<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>::~vector
            (unaff_retaddr);
  ConfigData::~ConfigData(in_RDI);
  IConfig::~IConfig((IConfig *)in_RDI);
  return;
}

Assistant:

Config::~Config() = default;